

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaAnnotDump(FILE *output,xmlSchemaAnnotPtr annot)

{
  xmlChar *pxVar1;
  
  pxVar1 = xmlNodeGetContent((xmlNode *)annot);
  if (pxVar1 != (xmlChar *)0x0) {
    fprintf((FILE *)output,"  Annot: %s\n",pxVar1);
    (*xmlFree)(pxVar1);
    return;
  }
  fwrite("  Annot: empty\n",0xf,1,(FILE *)output);
  return;
}

Assistant:

static void
xmlSchemaAnnotDump(FILE * output, xmlSchemaAnnotPtr annot)
{
    xmlChar *content;

    if (annot == NULL)
        return;

    content = xmlNodeGetContent(annot->content);
    if (content != NULL) {
        fprintf(output, "  Annot: %s\n", content);
        xmlFree(content);
    } else
        fprintf(output, "  Annot: empty\n");
}